

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * unpack27_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x7ffffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x1b;
  out[1] = (uVar1 >> 0x1b) + base + (in[1] & 0x3fffff) * 0x20;
  uVar1 = in[1];
  out[2] = uVar1 >> 0x16;
  out[2] = (uVar1 >> 0x16) + base + (in[2] & 0x1ffff) * 0x400;
  uVar1 = in[2];
  out[3] = uVar1 >> 0x11;
  out[3] = (uVar1 >> 0x11) + base + (in[3] & 0xfff) * 0x8000;
  uVar1 = in[3];
  out[4] = uVar1 >> 0xc;
  out[4] = (uVar1 >> 0xc) + base + (in[4] & 0x7f) * 0x100000;
  uVar1 = in[4];
  out[5] = uVar1 >> 7;
  out[5] = (uVar1 >> 7) + base + (in[5] & 3) * 0x2000000;
  out[6] = (in[5] >> 2 & 0x7ffffff) + base;
  uVar1 = in[5];
  out[7] = uVar1 >> 0x1d;
  out[7] = (uVar1 >> 0x1d) + base + (in[6] & 0xffffff) * 8;
  return in + 7;
}

Assistant:

uint32_t * unpack27_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 27 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  27  ) ;
    ++in;
    *out |= ((*in) % (1U<< 22 ))<<( 27 - 22 );
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 17 ))<<( 27 - 17 );
    *out += base;
    out++;
    *out = ( (*in) >>  17  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 27 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 7 ))<<( 27 - 7 );
    *out += base;
    out++;
    *out = ( (*in) >>  7  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 27 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 27 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  29  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 27 - 24 );
    *out += base;
    out++;

    return in + 1;
}